

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_checker.c
# Opt level: O2

uint8_t cio_check_utf8(cio_utf8_state *state,uint8_t *string,size_t count)

{
  uint8_t *state_00;
  uint8_t uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint_fast8_t i;
  bool bVar6;
  uint8_t buffer [8];
  ulong local_50;
  ulong local_48;
  undefined8 local_38;
  
  if (count < 8) {
    local_48 = 0;
    uVar4 = (uint)count;
    local_50 = 0;
    uVar2 = count;
  }
  else {
    uVar4 = -(int)string & 7;
    uVar2 = count - uVar4;
    local_48 = uVar2 >> 3;
    local_50 = (ulong)((uint)uVar2 & 7);
    uVar2 = (ulong)uVar4;
  }
  puVar5 = string + uVar2;
  state_00 = &state->state;
  for (lVar3 = 0; uVar4 != (uint)lVar3; lVar3 = lVar3 + 1) {
    uVar1 = decode(state_00,&state->codepoint,string[lVar3]);
    if (uVar1 == '\f') {
      return '\f';
    }
  }
  while (bVar6 = local_48 != 0, local_48 = local_48 - 1, bVar6) {
    local_38 = *(undefined8 *)puVar5;
    puVar5 = puVar5 + 8;
    lVar3 = 0;
    while (lVar3 != 8) {
      uVar1 = decode(state_00,&state->codepoint,*(uint8_t *)((long)&local_38 + lVar3));
      lVar3 = lVar3 + 1;
      if (uVar1 == '\f') {
        return '\f';
      }
    }
  }
  lVar3 = 0;
  while( true ) {
    if ((int)local_50 == (int)lVar3) {
      return *state_00;
    }
    uVar1 = decode(state_00,&state->codepoint,string[lVar3 + (count - local_50)]);
    if (uVar1 == '\f') break;
    lVar3 = lVar3 + 1;
  }
  return '\f';
}

Assistant:

uint8_t cio_check_utf8(struct cio_utf8_state *state, const uint8_t *string, size_t count)
{
	const uint_fast32_t *s_aligned = NULL;
	unsigned int pre_length = (unsigned int)count;
	size_t main_length = 0;
	unsigned int post_length = 0;

	if (count >= sizeof(*s_aligned)) {
		pre_length = ((uintptr_t)string) % sizeof(*s_aligned);
		pre_length = (sizeof(*s_aligned) - pre_length) % sizeof(*s_aligned);
		main_length = (count - pre_length) / sizeof(*s_aligned);
		post_length = (unsigned int)(count - pre_length - (main_length * sizeof(*s_aligned)));
	}

	s_aligned = (const void *)(string + pre_length);

	size_t i_p = 0;
	while (pre_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		pre_length--;
		i_p++;
	}

	while (main_length-- > 0) {
		uint8_t buffer[sizeof(uint_fast32_t)];
		memcpy(buffer, s_aligned, sizeof(buffer));
		s_aligned++;
		for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(buffer); i++) {
			uint8_t character = buffer[i];
			if (decode(&state->state, &state->codepoint, character) == CIO_UTF8_REJECT) {
				return CIO_UTF8_REJECT;
			}
		}
	}

	i_p = count - post_length;
	while (post_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		post_length--;
		i_p++;
	}

	return state->state;
}